

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O1

string * __thiscall
duckdb::StackTrace::GetStacktracePointers_abi_cxx11_
          (string *__return_storage_ptr__,StackTrace *this,idx_t max_depth)

{
  void *__val;
  bool bVar1;
  char cVar2;
  int iVar3;
  void **ppvVar4;
  unsigned_long uVar5;
  type ppvVar6;
  void *pvVar7;
  char cVar8;
  ulong __i;
  unique_ptr<void_*[],_std::default_delete<void_*[]>,_true> callstack;
  string __str;
  _Head_base<0UL,_void_**,_false> local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ppvVar4 = (void **)operator_new__(-(ulong)((ulong)this >> 0x3d != 0) | (long)this * 8);
  local_60._M_head_impl = ppvVar4;
  local_58 = &__return_storage_ptr__->field_2;
  iVar3 = NumericCastImpl<int,_unsigned_long,_false>::Convert((unsigned_long)this);
  iVar3 = backtrace(ppvVar4,iVar3);
  __i = 2;
  do {
    uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert(iVar3);
    if (uVar5 <= __i) {
      if (local_60._M_head_impl != (void **)0x0) {
        operator_delete__(local_60._M_head_impl);
      }
      return __return_storage_ptr__;
    }
    if (__return_storage_ptr__->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    ppvVar6 = unique_ptr<void_*[],_std::default_delete<void_*[]>,_true>::operator[]
                        ((unique_ptr<void_*[],_std::default_delete<void_*[]>,_true> *)&local_60,__i)
    ;
    __val = *ppvVar6;
    cVar8 = '\x01';
    if ((void *)0x9 < __val) {
      pvVar7 = __val;
      cVar2 = '\x04';
      do {
        cVar8 = cVar2;
        if (pvVar7 < (void *)0x64) {
          cVar8 = cVar8 + -2;
          goto LAB_01400072;
        }
        if (pvVar7 < (void *)0x3e8) {
          cVar8 = cVar8 + -1;
          goto LAB_01400072;
        }
        if (pvVar7 < (void *)0x2710) goto LAB_01400072;
        bVar1 = (void *)0x1869f < pvVar7;
        pvVar7 = (void *)((ulong)pvVar7 / 10000);
        cVar2 = cVar8 + '\x04';
      } while (bVar1);
      cVar8 = cVar8 + '\x01';
    }
LAB_01400072:
    local_50 = local_40;
    ::std::__cxx11::string::_M_construct((ulong)&local_50,cVar8);
    ::std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,(unsigned_long)__val);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    __i = __i + 1;
  } while( true );
}

Assistant:

string StackTrace::GetStacktracePointers(idx_t max_depth) {
	string result;
	auto callstack = unique_ptr<void *[]>(new void *[max_depth]);
	int frames = backtrace(callstack.get(), NumericCast<int32_t>(max_depth));
	// skip two frames (these are always StackTrace::...)
	for (idx_t i = 2; i < NumericCast<idx_t>(frames); i++) {
		if (!result.empty()) {
			result += ";";
		}
		result += to_string(CastPointerToValue(callstack[i]));
	}
	return result;
}